

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O2

bool LTFlightDataShowAircraft(void)

{
  bool bVar1;
  thread local_10;
  
  bVar1 = true;
  if (CalcPosThread._M_id._M_thread == 0) {
    bVar1 = LTFlightDataAnyTrackingChEnabled();
    if (bVar1) {
      bFDMainStop = false;
      std::thread::thread<void(&)(),,void>(&local_10,LTFlightData::CalcNextPosMain);
      std::thread::operator=(&CalcPosThread,&local_10);
      std::thread::~thread(&local_10);
      if ((int)dataRefs.iLogLevel < 2) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x3bd,"LTFlightDataShowAircraft",logINFO,"Requesting live flight data online...");
      }
      bVar1 = true;
      CreateMsgWindow(8.0,logINFO,"Requesting live flight data online...");
      initTimeBufFilled = -1.0;
      LTFlightDataStartJoinChannels();
    }
    else {
      if ((int)dataRefs.iLogLevel < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x3b3,"LTFlightDataShowAircraft",logERR,anon_var_dwarf_85895 + 4);
      }
      CreateMsgWindow(12.0,logERR,anon_var_dwarf_85895 + 4);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool LTFlightDataShowAircraft()
{
    // is there a calculation thread running already? -> just return
    if ( CalcPosThread.joinable() ) return true;
    
    // Verify if there are any enabled, active tracking data channels.
    // If not bail out and inform the user.
    if (!LTFlightDataAnyTrackingChEnabled())
    {
        SHOW_MSG(logERR, ERR_CH_NONE_ACTIVE);
        return false;
    }
    
    // create a new thread for position calculation
    bFDMainStop = false;
    CalcPosThread = std::thread ( LTFlightData::CalcNextPosMain );
    
    // tell the user we do something in the background
    SHOW_MSG(logINFO,
             MSG_REQUESTING_LIVE_FD);
    
    // flag for: as soon as data arrives start buffer countdown
    initTimeBufFilled = -1;
    
    // Start the required communication threads
    LTFlightDataStartJoinChannels();
    
    return true;
}